

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::statistics(tetgenmesh *this)

{
  uint uVar1;
  tetgenbehavior *ptVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  puts("\nStatistics:\n");
  printf("  Input points: %d\n",(ulong)(uint)this->in->numberofpoints);
  if (this->b->refine == 0) {
    if (this->b->plc != 0) {
      printf("  Input facets: %d\n",(ulong)(uint)this->in->numberoffacets);
      printf("  Input segments: %ld\n",this->insegments);
      if (0 < this->in->numberofedges) {
        printf("  Input edges: %d\n");
      }
      printf("  Input holes: %d\n",(ulong)(uint)this->in->numberofholes);
      uVar1 = this->in->numberofregions;
      pcVar3 = "  Input regions: %d\n";
      goto LAB_0014de9b;
    }
  }
  else {
    printf("  Input tetrahedra: %d\n",(ulong)(uint)this->in->numberoftetrahedra);
    if (0 < this->in->numberoftrifaces) {
      printf("  Input triangles: %d\n");
    }
    uVar1 = this->in->numberofedges;
    if (0 < (int)uVar1) {
      pcVar3 = "  Input edges: %d\n";
LAB_0014de9b:
      printf(pcVar3,(ulong)uVar1);
    }
  }
  uVar6 = this->tetrahedrons->items - this->hullsize;
  lVar4 = (long)(this->hullsize + uVar6 * 4) / 2;
  if (this->b->weighted == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = this->nonregularcount;
  }
  printf("\n  Mesh points: %ld\n",this->points->items - lVar5);
  printf("  Mesh tetrahedra: %ld\n",uVar6);
  printf("  Mesh faces: %ld\n",lVar4);
  lVar5 = this->meshedges;
  if (lVar5 < 1) {
    if (this->nonconvex == 0) {
      if (this->b->weighted == 0) {
        lVar5 = 0;
      }
      else {
        lVar5 = this->nonregularcount;
      }
      lVar5 = (lVar4 + ~uVar6 + this->points->items) - (this->dupverts + this->unuverts + lVar5);
      this->meshedges = lVar5;
      goto LAB_0014df21;
    }
  }
  else {
LAB_0014df21:
    printf("  Mesh edges: %ld\n",lVar5);
  }
  if ((this->b->plc == 0) && (this->b->refine == 0)) {
    printf("  Convex hull faces: %ld\n",this->hullsize);
    if (this->meshhulledges < 1) goto LAB_0014dffa;
    pcVar3 = "  Convex hull edges: %ld\n";
  }
  else {
    printf("  Mesh faces on exterior boundary: %ld\n",this->hullsize);
    if (0 < this->meshhulledges) {
      printf("  Mesh edges on exterior boundary: %ld\n");
    }
    printf("  Mesh faces on input facets: %ld\n",this->subfaces->items);
    printf("  Mesh edges on input segments: %ld\n",this->subsegs->items);
    if (0 < this->st_facref_count) {
      printf("  Steiner points on input facets:  %ld\n");
    }
    if (0 < this->st_segref_count) {
      printf("  Steiner points on input segments:  %ld\n");
    }
    if (this->st_volref_count < 1) goto LAB_0014dffa;
    pcVar3 = "  Steiner points inside domain: %ld\n";
  }
  printf(pcVar3);
LAB_0014dffa:
  if (this->b->weighted != 0) {
    printf("  Skipped non-regular points: %ld\n",this->nonregularcount);
  }
  putchar(10);
  ptVar2 = this->b;
  if (0 < ptVar2->verbose) {
    if (((ptVar2->plc != 0) || (ptVar2->refine != 0)) && (0 < this->tetrahedrons->items)) {
      qualitystatistics(this);
    }
    if (0 < this->tetrahedrons->items) {
      memorystatistics(this);
      return;
    }
  }
  return;
}

Assistant:

void tetgenmesh::statistics()
{
  long tetnumber, facenumber;

  printf("\nStatistics:\n\n");
  printf("  Input points: %d\n", in->numberofpoints);
  if (b->refine) {
    printf("  Input tetrahedra: %d\n", in->numberoftetrahedra);
    if (in->numberoftrifaces > 0) {
	  printf("  Input triangles: %d\n", in->numberoftrifaces);
    }
    if (in->numberofedges > 0) {
	  printf("  Input edges: %d\n", in->numberofedges);
	}
  } else if (b->plc) {
    printf("  Input facets: %d\n", in->numberoffacets);
    printf("  Input segments: %ld\n", insegments);
	if (in->numberofedges > 0) {
	  printf("  Input edges: %d\n", in->numberofedges);
	}
    printf("  Input holes: %d\n", in->numberofholes);
    printf("  Input regions: %d\n", in->numberofregions);
  }

  tetnumber = tetrahedrons->items - hullsize;
  facenumber = (tetnumber * 4l + hullsize) / 2l;

  if (b->weighted) { // -w option
    printf("\n  Mesh points: %ld\n", points->items - nonregularcount);
  } else {
    printf("\n  Mesh points: %ld\n", points->items);
  }
  printf("  Mesh tetrahedra: %ld\n", tetnumber);
  printf("  Mesh faces: %ld\n", facenumber);
  if (meshedges > 0l) {
    printf("  Mesh edges: %ld\n", meshedges);
  } else {
    if (!nonconvex) {
      long vsize = points->items - dupverts - unuverts;
      if (b->weighted) vsize -= nonregularcount;
      meshedges = vsize + facenumber - tetnumber - 1;
      printf("  Mesh edges: %ld\n", meshedges);
    }
  }

  if (b->plc || b->refine) {
    printf("  Mesh faces on exterior boundary: %ld\n", hullsize);
    if (meshhulledges > 0l) {
      printf("  Mesh edges on exterior boundary: %ld\n", meshhulledges);
    }
    printf("  Mesh faces on input facets: %ld\n", subfaces->items);
    printf("  Mesh edges on input segments: %ld\n", subsegs->items);
    if (st_facref_count > 0l) {
      printf("  Steiner points on input facets:  %ld\n", st_facref_count);
    }
    if (st_segref_count > 0l) {
      printf("  Steiner points on input segments:  %ld\n", st_segref_count);
    }
    if (st_volref_count > 0l) {
      printf("  Steiner points inside domain: %ld\n", st_volref_count);
    }
  } else {
    printf("  Convex hull faces: %ld\n", hullsize);
    if (meshhulledges > 0l) {
      printf("  Convex hull edges: %ld\n", meshhulledges);
    }
  }
  if (b->weighted) { // -w option
    printf("  Skipped non-regular points: %ld\n", nonregularcount);
  }
  printf("\n");


  if (b->verbose > 0) {
    if (b->plc || b->refine) { // -p or -r
      if (tetrahedrons->items > 0l) {
        qualitystatistics();
      }
    }
    if (tetrahedrons->items > 0l) {
      memorystatistics();
    }
  }
}